

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

AggregateInitialiserList * __thiscall
soul::PoolAllocator::
allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation&,soul::Type_const&>
          (PoolAllocator *this,CodeLocation *args,Type *args_1)

{
  PoolItem *pPVar1;
  CodeLocation local_30;
  
  pPVar1 = allocateSpaceForObject(this,0x68);
  local_30.sourceCode.object = (args->sourceCode).object;
  if (local_30.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_30.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_30.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_30.location.data = (args->location).data;
  heart::AggregateInitialiserList::AggregateInitialiserList
            ((AggregateInitialiserList *)&pPVar1->item,&local_30,args_1);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_30.sourceCode.object);
  pPVar1->destructor =
       allocate<soul::heart::AggregateInitialiserList,_soul::CodeLocation_&,_const_soul::Type_&>::
       anon_class_1_0_00000001::__invoke;
  return (AggregateInitialiserList *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }